

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O1

void __thiscall
Js::DataView::SetValue<unsigned_char,unsigned_char*>
          (DataView *this,Var offset,uchar value,BOOL isLittleEndian,char16 *funcName)

{
  Type TVar1;
  ScriptContext *scriptContext;
  uint32 uVar2;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  TVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  if (TVar1 == 0) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec1f,funcName);
  }
  uVar2 = ArrayBuffer::ToIndex(offset,-0x7ff5ec1f,scriptContext,TVar1 - 1,false);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
    (this->buffer).ptr[uVar2] = value;
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,funcName);
}

Assistant:

void SetValue(Var offset, TypeName value, BOOL isLittleEndian, const char16 *funcName)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(&value, typedBuffer);
            }
            else
            {
                *static_cast<PointerAccessTypeName>(typedBuffer) = value;
            }
        }